

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TwoStageDynamicBayesianNetwork.cpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
TwoStageDynamicBayesianNetwork::GetNrVals_YSoI_O(TwoStageDynamicBayesianNetwork *this,Index oI)

{
  E *this_00;
  
  if (this->_m_ii_initialized != false) {
    return (this->_m_nrVals_YSoI_O).
           super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + oI;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"ii (influence instantiation) meta-info is not initialized");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

const vector<size_t>& TwoStageDynamicBayesianNetwork::
GetNrVals_YSoI_O(Index oI) const
{
    if(!_m_ii_initialized)
        throw E("ii (influence instantiation) meta-info is not initialized");
    return _m_nrVals_YSoI_O[oI];
}